

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,uint *params_1,MaybeUint *params_2,MaybeUint *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  uint *params_00;
  long lVar4;
  String argValues [4];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  String local_b0;
  String local_98;
  String local_80;
  char *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  char *local_50;
  size_t sStack_48;
  ArrayDisposer *pAStack_40;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_98;
  heapString(__return_storage_ptr__,5);
  if ((char *)local_98.content.size_ != (char *)0x0) {
    local_98.content.size_ = (size_t)local_98.content.ptr;
  }
  builtin_strncpy((char *)local_98.content.size_,"false",5);
  str<unsigned_int&>(&local_80,(kj *)params_1,params_00);
  BTreeImpl::MaybeUint::toString(&local_b0,params_2);
  local_68 = local_b0.content.ptr;
  local_60 = local_b0.content.size_;
  pAStack_58 = local_b0.content.disposer;
  BTreeImpl::MaybeUint::toString(&local_b0,params_3);
  local_50 = local_b0.content.ptr;
  sStack_48 = local_b0.content.size_;
  pAStack_40 = local_b0.content.disposer;
  uVar5 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}